

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O3

MPP_RET mpp_dec_notify_normal(MppDecImpl *dec,RK_U32 flag)

{
  uint uVar1;
  MppThread *pMVar2;
  RK_U32 old_flag;
  uint uVar3;
  undefined8 in_RAX;
  undefined4 uVar4;
  
  uVar4 = (undefined4)((ulong)in_RAX >> 0x20);
  pMVar2 = dec->thread_parser;
  if (pMVar2 == (MppThread *)0x0) {
    return MPP_NOK;
  }
  pthread_mutex_lock((pthread_mutex_t *)pMVar2->mMutexCond);
  uVar1 = dec->parser_notify_flag;
  if (flag == 0x10000) {
    uVar3 = uVar1 | 0x10000;
    dec->parser_notify_flag = uVar3;
  }
  else {
    uVar3 = flag | uVar1;
    dec->parser_notify_flag = uVar3;
    if ((uVar1 == uVar3) || ((dec->parser_wait_flag & uVar3) == 0)) goto LAB_00148c40;
  }
  if (((byte)mpp_dec_debug & 0x80) != 0) {
    _mpp_log_l(4,"mpp_dec","%p status %08x notify control signal\n","mpp_dec_notify_normal",dec,
               (ulong)dec->parser_wait_flag,CONCAT44(uVar4,uVar3));
  }
  pthread_cond_signal((pthread_cond_t *)&pMVar2->mMutexCond[0].mCondition);
LAB_00148c40:
  pthread_mutex_unlock((pthread_mutex_t *)pMVar2->mMutexCond);
  return MPP_OK;
}

Assistant:

MPP_RET mpp_dec_notify_normal(MppDecImpl *dec, RK_U32 flag)
{
    MppThread *thd_dec  = dec->thread_parser;
    RK_U32 notify = 0;

    if (!thd_dec)
        return MPP_NOK;

    thd_dec->lock();
    if (flag == MPP_DEC_CONTROL) {
        dec->parser_notify_flag |= flag;
        notify = 1;
    } else {
        RK_U32 old_flag = dec->parser_notify_flag;

        dec->parser_notify_flag |= flag;
        if ((old_flag != dec->parser_notify_flag) &&
            (dec->parser_notify_flag & dec->parser_wait_flag))
            notify = 1;
    }

    if (notify) {
        dec_dbg_notify("%p status %08x notify control signal\n", dec,
                       dec->parser_wait_flag, dec->parser_notify_flag);
        thd_dec->signal();
    }
    thd_dec->unlock();

    return MPP_OK;
}